

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Calendar::fieldDifference
          (Calendar *this,UDate targetMs,UCalendarDateFields field,UErrorCode *ec)

{
  UBool UVar1;
  bool bVar2;
  double millis;
  double dVar3;
  double ms_3;
  int32_t t_1;
  double ms_2;
  int32_t max_1;
  double ms_1;
  int32_t t;
  double ms;
  int32_t max;
  double startMs;
  int32_t min;
  UErrorCode *ec_local;
  UCalendarDateFields field_local;
  UDate targetMs_local;
  Calendar *this_local;
  
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 == '\0') {
    startMs._4_4_ = 0;
    millis = getTimeInMillis(this,ec);
    if (targetMs <= millis) {
      if (millis <= targetMs) {
LAB_002146db:
        setTimeInMillis(this,millis,ec);
        (*(this->super_UObject)._vptr_UObject[7])(this,(ulong)field,(ulong)startMs._4_4_,ec);
        UVar1 = ::U_FAILURE(*ec);
        if (UVar1 == '\0') {
          this_local._4_4_ = startMs._4_4_;
        }
        else {
          this_local._4_4_ = 0;
        }
      }
      else {
        ms_2._4_4_ = 0xffffffff;
        while (UVar1 = ::U_SUCCESS(*ec), this_local._4_4_ = startMs._4_4_, UVar1 != '\0') {
          setTimeInMillis(this,millis,ec);
          (*(this->super_UObject)._vptr_UObject[7])(this,(ulong)field,(ulong)ms_2._4_4_,ec);
          dVar3 = getTimeInMillis(this,ec);
          if ((dVar3 == targetMs) && (!NAN(dVar3) && !NAN(targetMs))) {
            return ms_2._4_4_;
          }
          if (dVar3 < targetMs) break;
          startMs._4_4_ = ms_2._4_4_;
          ms_2._4_4_ = ms_2._4_4_ << 1;
          if (ms_2._4_4_ == 0) {
            *ec = U_ILLEGAL_ARGUMENT_ERROR;
          }
        }
LAB_00214608:
        startMs._4_4_ = this_local._4_4_;
        bVar2 = false;
        if (1 < (int)(startMs._4_4_ - ms_2._4_4_)) {
          UVar1 = ::U_SUCCESS(*ec);
          bVar2 = UVar1 != '\0';
        }
        if (!bVar2) goto LAB_002146db;
        this_local._4_4_ = startMs._4_4_ + (int)(ms_2._4_4_ - startMs._4_4_) / 2;
        setTimeInMillis(this,millis,ec);
        (*(this->super_UObject)._vptr_UObject[7])(this,(ulong)field,(ulong)this_local._4_4_,ec);
        dVar3 = getTimeInMillis(this,ec);
        if ((dVar3 != targetMs) || (NAN(dVar3) || NAN(targetMs))) {
          if (dVar3 < targetMs) {
            ms_2._4_4_ = this_local._4_4_;
            this_local._4_4_ = startMs._4_4_;
          }
          goto LAB_00214608;
        }
      }
    }
    else {
      ms._4_4_ = 1;
      while (UVar1 = ::U_SUCCESS(*ec), this_local._4_4_ = startMs._4_4_, UVar1 != '\0') {
        setTimeInMillis(this,millis,ec);
        (*(this->super_UObject)._vptr_UObject[7])(this,(ulong)field,(ulong)ms._4_4_,ec);
        dVar3 = getTimeInMillis(this,ec);
        if ((dVar3 == targetMs) && (!NAN(dVar3) && !NAN(targetMs))) {
          return ms._4_4_;
        }
        if (targetMs < dVar3) break;
        if ((int)ms._4_4_ < 0x7fffffff) {
          startMs._4_4_ = ms._4_4_;
          ms._4_4_ = ms._4_4_ << 1;
          if ((int)ms._4_4_ < 0) {
            ms._4_4_ = 0x7fffffff;
          }
        }
        else {
          *ec = U_ILLEGAL_ARGUMENT_ERROR;
        }
      }
LAB_0021447f:
      startMs._4_4_ = this_local._4_4_;
      bVar2 = false;
      if (1 < (int)(ms._4_4_ - startMs._4_4_)) {
        UVar1 = ::U_SUCCESS(*ec);
        bVar2 = UVar1 != '\0';
      }
      if (!bVar2) goto LAB_002146db;
      this_local._4_4_ = startMs._4_4_ + (int)(ms._4_4_ - startMs._4_4_) / 2;
      setTimeInMillis(this,millis,ec);
      (*(this->super_UObject)._vptr_UObject[7])(this,(ulong)field,(ulong)this_local._4_4_,ec);
      dVar3 = getTimeInMillis(this,ec);
      if ((dVar3 != targetMs) || (NAN(dVar3) || NAN(targetMs))) {
        if (targetMs < dVar3) {
          ms._4_4_ = this_local._4_4_;
          this_local._4_4_ = startMs._4_4_;
        }
        goto LAB_0021447f;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t Calendar::fieldDifference(UDate targetMs, UCalendarDateFields field, UErrorCode& ec) {
    if (U_FAILURE(ec)) return 0;
    int32_t min = 0;
    double startMs = getTimeInMillis(ec);
    // Always add from the start millis.  This accomodates
    // operations like adding years from February 29, 2000 up to
    // February 29, 2004.  If 1, 1, 1, 1 is added to the year
    // field, the DOM gets pinned to 28 and stays there, giving an
    // incorrect DOM difference of 1.  We have to add 1, reset, 2,
    // reset, 3, reset, 4.
    if (startMs < targetMs) {
        int32_t max = 1;
        // Find a value that is too large
        while (U_SUCCESS(ec)) {
            setTimeInMillis(startMs, ec);
            add(field, max, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return max;
            } else if (ms > targetMs) {
                break;
            } else if (max < INT32_MAX) {
                min = max;
                max <<= 1;
                if (max < 0) {
                    max = INT32_MAX;
                }
            } else {
                // Field difference too large to fit into int32_t
#if defined (U_DEBUG_CAL)
                fprintf(stderr, "%s:%d: ILLEGAL ARG because field %s's max too large for int32_t\n",
                    __FILE__, __LINE__, fldName(field));
#endif
                ec = U_ILLEGAL_ARGUMENT_ERROR;
            }
        }
        // Do a binary search
        while ((max - min) > 1 && U_SUCCESS(ec)) {
            int32_t t = min + (max - min)/2; // make sure intermediate values don't exceed INT32_MAX
            setTimeInMillis(startMs, ec);
            add(field, t, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return t;
            } else if (ms > targetMs) {
                max = t;
            } else {
                min = t;
            }
        }
    } else if (startMs > targetMs) {
        int32_t max = -1;
        // Find a value that is too small
        while (U_SUCCESS(ec)) {
            setTimeInMillis(startMs, ec);
            add(field, max, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return max;
            } else if (ms < targetMs) {
                break;
            } else {
                min = max;
                max <<= 1;
                if (max == 0) {
                    // Field difference too large to fit into int32_t
#if defined (U_DEBUG_CAL)
                    fprintf(stderr, "%s:%d: ILLEGAL ARG because field %s's max too large for int32_t\n",
                        __FILE__, __LINE__, fldName(field));
#endif
                    ec = U_ILLEGAL_ARGUMENT_ERROR;
                }
            }
        }
        // Do a binary search
        while ((min - max) > 1 && U_SUCCESS(ec)) {
            int32_t t = min + (max - min)/2; // make sure intermediate values don't exceed INT32_MAX
            setTimeInMillis(startMs, ec);
            add(field, t, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return t;
            } else if (ms < targetMs) {
                max = t;
            } else {
                min = t;
            }
        }
    }
    // Set calendar to end point
    setTimeInMillis(startMs, ec);
    add(field, min, ec);

    /* Test for buffer overflows */
    if(U_FAILURE(ec)) {
        return 0;
    }
    return min;
}